

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

void __thiscall Highs::invalidateSolverData(Highs *this)

{
  this->model_status_ = kMin;
  invalidateSolution(this);
  invalidateBasis(this);
  HighsRanging::invalidate(&this->ranging_);
  HighsInfo::invalidate(&this->info_);
  HEkk::invalidate(&this->ekk_instance_);
  HighsIis::invalidate(&this->iis_);
  return;
}

Assistant:

void Highs::invalidateSolverData() {
  invalidateModelStatus();
  invalidateSolution();
  invalidateBasis();
  invalidateRanging();
  invalidateInfo();
  invalidateEkk();
  invalidateIis();
}